

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall Assimp::FBX::MeshGeometry::ReadLayerElement(MeshGeometry *this,Scope *layerElement)

{
  int index_00;
  string *type_00;
  bool bVar1;
  Element *pEVar2;
  Element *pEVar3;
  Token *pTVar4;
  reference ppVar5;
  Scope *source;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  Token *t;
  ElementCollection EVar7;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined4 local_e0;
  int local_dc;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Stack_d8;
  int index;
  const_iterator it;
  ElementCollection candidates;
  Scope *top;
  undefined1 local_b0 [4];
  int typedIndex;
  string *local_90;
  string *type;
  string local_80;
  Element *local_60;
  Element *TypedIndex;
  allocator<char> local_41;
  string local_40;
  Element *local_20;
  Element *Type;
  Scope *layerElement_local;
  MeshGeometry *this_local;
  
  Type = (Element *)layerElement;
  layerElement_local = (Scope *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Type",&local_41);
  pEVar2 = GetRequiredElement(layerElement,&local_40,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pEVar3 = Type;
  local_20 = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"TypedIndex",(allocator<char> *)((long)&type + 7));
  pEVar3 = GetRequiredElement((Scope *)pEVar3,&local_80,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
  local_60 = pEVar3;
  pTVar4 = GetRequiredToken(local_20,0);
  ParseTokenAsString_abi_cxx11_((string *)local_b0,(FBX *)pTVar4,t);
  local_90 = (string *)local_b0;
  pTVar4 = GetRequiredToken(local_60,0);
  top._4_4_ = ParseTokenAsInt(pTVar4);
  candidates.second._M_node =
       (_Base_ptr)GetRequiredScope((this->super_Geometry).super_Object.element);
  EVar7 = Scope::GetCollection((Scope *)candidates.second._M_node,local_90);
  it._M_node = (_Base_ptr)EVar7.first._M_node;
  do {
    candidates.first = EVar7.second._M_node;
    _Stack_d8 = EVar7.first._M_node;
    bVar1 = std::operator!=(&stack0xffffffffffffff28,&candidates.first);
    if (!bVar1) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                (&local_258,(char (*) [41])"failed to resolve vertex layer element: ");
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_258,local_90);
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar6,(char (*) [10])", index: ");
      message = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar6,(int *)((long)&top + 4));
      LogFunctions<Assimp::FBXImporter>::LogError(message);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_258);
      local_e0 = 0;
LAB_00a2c0d9:
      std::__cxx11::string::~string((string *)local_b0);
      return;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
             ::operator*(&stack0xffffffffffffff28);
    pTVar4 = GetRequiredToken(ppVar5->second,0);
    local_dc = ParseTokenAsInt(pTVar4);
    type_00 = local_90;
    index_00 = top._4_4_;
    if (local_dc == top._4_4_) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
               ::operator*(&stack0xffffffffffffff28);
      source = GetRequiredScope(ppVar5->second);
      ReadVertexData(this,type_00,index_00,source);
      local_e0 = 1;
      goto LAB_00a2c0d9;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
    ::operator++(&stack0xffffffffffffff28);
    EVar7.second._M_node = candidates.first._M_node;
    EVar7.first._M_node = _Stack_d8._M_node;
  } while( true );
}

Assistant:

void MeshGeometry::ReadLayerElement(const Scope& layerElement)
{
    const Element& Type = GetRequiredElement(layerElement,"Type");
    const Element& TypedIndex = GetRequiredElement(layerElement,"TypedIndex");

    const std::string& type = ParseTokenAsString(GetRequiredToken(Type,0));
    const int typedIndex = ParseTokenAsInt(GetRequiredToken(TypedIndex,0));

    const Scope& top = GetRequiredScope(element);
    const ElementCollection candidates = top.GetCollection(type);

    for (ElementMap::const_iterator it = candidates.first; it != candidates.second; ++it) {
        const int index = ParseTokenAsInt(GetRequiredToken(*(*it).second,0));
        if(index == typedIndex) {
            ReadVertexData(type,typedIndex,GetRequiredScope(*(*it).second));
            return;
        }
    }

    FBXImporter::LogError(Formatter::format("failed to resolve vertex layer element: ")
        << type << ", index: " << typedIndex);
}